

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjpeghandler.cpp
# Opt level: O0

bool read_jpeg_format(Format *format,j_decompress_ptr cinfo)

{
  int iVar1;
  bool result;
  j_decompress_ptr cinfo_local;
  Format *format_local;
  
  result = true;
  iVar1 = cinfo->output_components;
  if (iVar1 == 1) {
    *format = Format_Grayscale8;
  }
  else if (iVar1 == 3) {
    *format = Format_RGB32;
  }
  else if (iVar1 == 4) {
    if (cinfo->out_color_space == JCS_CMYK) {
      *format = Format_CMYK8888;
    }
    else {
      *format = Format_RGB32;
    }
  }
  else {
    result = false;
  }
  cinfo->output_scanline = cinfo->output_height;
  return result;
}

Assistant:

inline static bool read_jpeg_format(QImage::Format &format, j_decompress_ptr cinfo)
{

    bool result = true;
    switch (cinfo->output_components) {
    case 1:
        format = QImage::Format_Grayscale8;
        break;
    case 3:
        format = QImage::Format_RGB32;
        break;
    case 4:
        if (cinfo->out_color_space == JCS_CMYK)
            format = QImage::Format_CMYK8888;
        else
            format = QImage::Format_RGB32;
        break;
    default:
        result = false;
        break;
    }
    cinfo->output_scanline = cinfo->output_height;
    return result;
}